

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlFdClose(void *context)

{
  int iVar1;
  int *piVar2;
  int ret;
  int fd;
  xmlFdIOCtxt *fdctxt;
  void *context_local;
  
  iVar1 = close(*context);
  (*xmlFree)(context);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    context_local._4_4_ = xmlIOErr(*piVar2);
  }
  else {
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int
xmlFdClose (void * context) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret;

    ret = close(fd);

    xmlFree(fdctxt);

    if (ret < 0)
        return(xmlIOErr(errno));

    return(XML_ERR_OK);
}